

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

Rectangle * __thiscall
QPDFObjectHandle::getArrayAsRectangle(Rectangle *__return_storage_ptr__,QPDFObjectHandle *this)

{
  double llx;
  double lly;
  double urx;
  bool bVar1;
  int iVar2;
  double *pdVar3;
  pair<bool,_QPDFObjectHandle> local_88;
  undefined1 local_70 [8];
  QPDFObjectHandle item;
  int i;
  double items [4];
  undefined1 local_28 [8];
  Array array;
  QPDFObjectHandle *this_local;
  
  array.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                    )this;
  as_array((Array *)local_28,this,strict);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_28);
  if (bVar1) {
    iVar2 = ::qpdf::Array::size((Array *)local_28);
    if (iVar2 == 4) {
      for (item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ = 0;
          item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ < 4;
          item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ =
               item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ + 1) {
        ::qpdf::Array::at(&local_88,(Array *)local_28,
                          item.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi._4_4_);
        QPDFObjectHandle((QPDFObjectHandle *)local_70,&local_88.second);
        std::pair<bool,_QPDFObjectHandle>::~pair(&local_88);
        bVar1 = getValueAsNumber((QPDFObjectHandle *)local_70,
                                 (double *)
                                 (&stack0xffffffffffffffa8 +
                                 (long)item.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi._4_4_ * 8));
        if (!bVar1) {
          Rectangle::Rectangle(__return_storage_ptr__);
        }
        items[3]._1_3_ = 0;
        items[3]._0_1_ = !bVar1;
        ~QPDFObjectHandle((QPDFObjectHandle *)local_70);
        if (items[3]._0_4_ != 0) goto LAB_00330346;
      }
      pdVar3 = std::min<double>((double *)&stack0xffffffffffffffa8,items + 1);
      llx = *pdVar3;
      pdVar3 = std::min<double>(items,items + 2);
      lly = *pdVar3;
      pdVar3 = std::max<double>((double *)&stack0xffffffffffffffa8,items + 1);
      urx = *pdVar3;
      pdVar3 = std::max<double>(items,items + 2);
      Rectangle::Rectangle(__return_storage_ptr__,llx,lly,urx,*pdVar3);
      items[3]._0_4_ = 1;
    }
    else {
      Rectangle::Rectangle(__return_storage_ptr__);
      items[3]._0_4_ = 1;
    }
  }
  else {
    items[3]._0_4_ = 0;
  }
LAB_00330346:
  ::qpdf::Array::~Array((Array *)local_28);
  if (items[3]._0_4_ == 0) {
    Rectangle::Rectangle(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFObjectHandle::getArrayAsRectangle() const
{
    if (auto array = as_array(strict)) {
        if (array.size() != 4) {
            return {};
        }
        double items[4];
        for (int i = 0; i < 4; ++i) {
            if (auto item = array.at(i).second; !item.getValueAsNumber(items[i])) {
                return {};
            }
        }
        return {
            std::min(items[0], items[2]),
            std::min(items[1], items[3]),
            std::max(items[0], items[2]),
            std::max(items[1], items[3])};
    }
    return {};
}